

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

void decodeQuantum(uchar *dest,char *src)

{
  uchar uVar1;
  bool bVar2;
  ulong local_40;
  unsigned_long x;
  unsigned_long v;
  unsigned_long i;
  char *p;
  char *s;
  char *src_local;
  uchar *dest_local;
  
  local_40 = 0;
  p = src;
  for (v = 0; v < 4; v = v + 1) {
    x = 0;
    i = (unsigned_long)table64;
    while( true ) {
      bVar2 = false;
      if (*(char *)i != '\0') {
        bVar2 = *(char *)i != *p;
      }
      if (!bVar2) break;
      x = x + 1;
      i = i + 1;
    }
    if (*(char *)i == *p) {
      local_40 = local_40 * 0x40 + x;
    }
    else if (*p == '=') {
      local_40 = local_40 << 6;
    }
    p = p + 1;
  }
  uVar1 = curlx_ultouc(local_40 & 0xff);
  dest[2] = uVar1;
  uVar1 = curlx_ultouc(local_40 >> 8 & 0xff);
  dest[1] = uVar1;
  uVar1 = curlx_ultouc(local_40 >> 0x10 & 0xff);
  *dest = uVar1;
  return;
}

Assistant:

static void decodeQuantum(unsigned char *dest, const char *src)
{
  const char *s, *p;
  unsigned long i, v, x = 0;

  for(i = 0, s = src; i < 4; i++, s++) {
    v = 0;
    p = table64;
    while(*p && (*p != *s)) {
      v++;
      p++;
    }
    if(*p == *s)
      x = (x << 6) + v;
    else if(*s == '=')
      x = (x << 6);
  }

  dest[2] = curlx_ultouc(x & 0xFFUL);
  x >>= 8;
  dest[1] = curlx_ultouc(x & 0xFFUL);
  x >>= 8;
  dest[0] = curlx_ultouc(x & 0xFFUL);
}